

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteVertexArrays
          (ReferenceContext *this,int numArrays,deUint32 *vertexArrays)

{
  VertexArray *local_40;
  VertexArray *vertexArray;
  deUint32 name;
  int i;
  deUint32 *vertexArrays_local;
  int numArrays_local;
  ReferenceContext *this_local;
  
  for (vertexArray._4_4_ = 0; vertexArray._4_4_ < numArrays;
      vertexArray._4_4_ = vertexArray._4_4_ + 1) {
    if (vertexArrays[vertexArray._4_4_] == 0) {
      local_40 = (VertexArray *)0x0;
    }
    else {
      local_40 = rc::ObjectManager<sglr::rc::VertexArray>::find
                           (&this->m_vertexArrays,vertexArrays[vertexArray._4_4_]);
    }
    if (local_40 != (VertexArray *)0x0) {
      deleteVertexArray(this,local_40);
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteVertexArrays (int numArrays, const deUint32* vertexArrays)
{
	for (int i = 0; i < numArrays; i++)
	{
		deUint32		name		= vertexArrays[i];
		VertexArray*	vertexArray	= name ? m_vertexArrays.find(name) : DE_NULL;

		if (vertexArray)
			deleteVertexArray(vertexArray);
	}
}